

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler_unittest.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b15::ProfileHandlerTest::VerifyDisabled(ProfileHandlerTest *this)

{
  bool bVar1;
  ProfileHandlerTest *pPVar2;
  char *pcVar3;
  char *in_R9;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  uint64_t interrupts_before;
  AssertHelper local_30;
  AssertHelper local_28;
  AssertHelper local_20;
  uint64_t interrupts_after;
  
  local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
  local_20.data_._0_4_ = GetCallbackCount(this);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_60,"0","GetCallbackCount()",(int *)&local_40,(uint *)&local_20);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x131,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  bVar1 = IsTimerEnabled();
  pPVar2 = (ProfileHandlerTest *)&interrupts_before;
  local_40._M_head_impl._0_1_ = !bVar1;
  interrupts_before = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_40,(AssertionResult *)0x12e1df,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x133,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)local_60);
    if (local_20.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_20.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pPVar2);
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       GetInterruptCount(pPVar2);
  pPVar2 = (ProfileHandlerTest *)0xbebc200;
  Delay(200000000);
  local_20.data_ = (AssertHelperData *)GetInterruptCount(pPVar2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_60,"interrupts_before","interrupts_after",(unsigned_long *)&local_40,
             (unsigned_long *)&local_20);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x138,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((BusyThread *)local_28.data_ != (BusyThread *)0x0) {
      (**(code **)(*(long *)local_28.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  return;
}

Assistant:

void VerifyDisabled() {
    // Check that the callback count is 0.
    EXPECT_EQ(0, GetCallbackCount());
    // Check that the timer is disabled.
    EXPECT_FALSE(IsTimerEnabled());
    // Verify that the ProfileHandler is not accumulating profile ticks.
    uint64_t interrupts_before = GetInterruptCount();
    Delay(kSleepInterval);
    uint64_t interrupts_after = GetInterruptCount();
    EXPECT_EQ(interrupts_before, interrupts_after);
  }